

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O1

void __thiscall TCV::handleChainCalls(TCV *this,string *nodeName,ASTNode *node)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = isCalledOnObject(node);
  if (bVar1) {
    bVar1 = false;
LAB_0012f13e:
    checkIfClassFunctionCalledWithRightAccess(this,nodeName,node,bVar1);
    return;
  }
  bVar1 = isCalledOnFunction(node);
  if (!bVar1) {
    checkIfFreeFunctionCalledWithRightArgument(this,nodeName,node);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)&this->returnType);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&this->returnType);
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_0012f13e;
    }
  }
  return;
}

Assistant:

void TCV::handleChainCalls(std::string &nodeName, AST::ASTNode *node) {
    if (isCalledOnObject(node)) {
        checkIfClassFunctionCalledWithRightAccess(nodeName, node);
    } else if (isCalledOnFunction(node)) {
        if (Variable::isTypeId(returnType))
            checkIfClassFunctionCalledWithRightAccess(nodeName, node, true);
    } else checkIfFreeFunctionCalledWithRightArgument(nodeName, node);
}